

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# js_generator.cc
# Opt level: O0

string * google::protobuf::compiler::js::anon_unknown_0::StripProto
                   (string *__return_storage_ptr__,string *filename)

{
  char *str;
  bool bVar1;
  char *__s;
  allocator<char> local_79;
  string local_78;
  allocator<char> local_41;
  string local_40;
  char *local_20;
  char *suffix;
  string *filename_local;
  
  suffix = (char *)filename;
  filename_local = __return_storage_ptr__;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_40,".protodevel",&local_41);
  bVar1 = HasSuffixString(filename,&local_40);
  __s = ".proto";
  if (bVar1) {
    __s = ".protodevel";
  }
  std::__cxx11::string::~string((string *)&local_40);
  std::allocator<char>::~allocator(&local_41);
  str = suffix;
  local_20 = __s;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_78,__s,&local_79);
  StripSuffixString(__return_storage_ptr__,(string *)str,&local_78);
  std::__cxx11::string::~string((string *)&local_78);
  std::allocator<char>::~allocator(&local_79);
  return __return_storage_ptr__;
}

Assistant:

string StripProto(const string& filename) {
  const char* suffix = HasSuffixString(filename, ".protodevel")
      ? ".protodevel" : ".proto";
  return StripSuffixString(filename, suffix);
}